

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::ValidationState_t::CooperativeVectorDimensionsMatch
          (ValidationState_t *this,Instruction *inst,uint32_t v1,uint32_t v2)

{
  undefined4 uVar1;
  _Head_base<1UL,_bool,_false> _Var2;
  uint id;
  uint id_00;
  Instruction *this_00;
  Instruction *this_01;
  char *pcVar3;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  this_00 = FindDef(this,v1);
  this_01 = FindDef(this,v2);
  if ((this_00->inst_).opcode == (this_01->inst_).opcode) {
    id = Instruction::GetOperandAs<unsigned_int>(this_00,2);
    id_00 = Instruction::GetOperandAs<unsigned_int>(this_01,2);
    EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id);
    _Var2._M_head_impl = local_208[4];
    uVar1 = local_208._0_4_;
    EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id_00);
    if (_Var2._M_head_impl != true) {
      return SPV_SUCCESS;
    }
    if (local_208[4] == false) {
      return SPV_SUCCESS;
    }
    if (uVar1 == local_208._0_4_) {
      return SPV_SUCCESS;
    }
    diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
    pcVar3 = "Expected number of components to be identical";
  }
  else {
    diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
    pcVar3 = "Expected cooperative vector types";
  }
  std::operator<<((ostream *)local_208,pcVar3);
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  return local_38;
}

Assistant:

spv_result_t ValidationState_t::CooperativeVectorDimensionsMatch(
    const Instruction* inst, uint32_t v1, uint32_t v2) {
  const auto v1_type = FindDef(v1);
  const auto v2_type = FindDef(v2);

  if (v1_type->opcode() != v2_type->opcode()) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected cooperative vector types";
  }

  uint32_t v1_components_id = v1_type->GetOperandAs<uint32_t>(2);
  uint32_t v2_components_id = v2_type->GetOperandAs<uint32_t>(2);

  bool v1_is_int32 = false, v1_is_const_int32 = false, v2_is_int32 = false,
       v2_is_const_int32 = false;
  uint32_t v1_value = 0, v2_value = 0;

  std::tie(v1_is_int32, v1_is_const_int32, v1_value) =
      EvalInt32IfConst(v1_components_id);
  std::tie(v2_is_int32, v2_is_const_int32, v2_value) =
      EvalInt32IfConst(v2_components_id);

  if (v1_is_const_int32 && v2_is_const_int32 && v1_value != v2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected number of components to be identical";
  }

  return SPV_SUCCESS;
}